

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_load_image_from_file_data
          (rf_image *__return_storage_ptr__,void *src,rf_int src_size,rf_allocator allocator,
          rf_allocator temp_allocator)

{
  rf_source_location source_location;
  rf_source_location rVar1;
  rf_source_location source_location_00;
  rf_allocator_args rVar2;
  int iVar3;
  stbi_uc *__src;
  void *__dest;
  long lVar4;
  long *in_FS_OFFSET;
  undefined8 uVar5;
  long lVar6;
  undefined4 uStack_14c;
  uint uStack_11c;
  undefined4 uStack_e4;
  uint uStack_b4;
  void *result_buffer;
  int stbi_result_size;
  void *stbi_result;
  uint local_68;
  int channels;
  int height;
  int width;
  char *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  rf_int local_28;
  rf_int src_size_local;
  void *src_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  src_local = allocator.user_data;
  local_28 = src_size;
  src_size_local = (rf_int)src;
  if ((src == (void *)0x0) || (src_size < 1)) {
    local_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_38 = "rf_load_image_from_file_data";
    local_30 = 0x3c7b;
    rf_log_impl(8,0x1b2749,(char *)0x1);
    lVar6 = *in_FS_OFFSET;
    _height = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_58 = "rf_load_image_from_file_data";
    local_50 = 0x3c7b;
    local_48 = 1;
    *(char **)(lVar6 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar6 + -0x458) = "rf_load_image_from_file_data";
    *(undefined8 *)(lVar6 + -0x450) = 0x3c7b;
    *(ulong *)(lVar6 + -0x448) = CONCAT44(uStack_44,1);
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    channels = 0;
    local_68 = 0;
    stbi_result._4_4_ = 0;
    lVar6 = *in_FS_OFFSET;
    *(void **)(lVar6 + -0x440) = temp_allocator.user_data;
    *(rf_allocator_proc **)(lVar6 + -0x438) = temp_allocator.allocator_proc;
    __src = stbi_load_from_memory
                      ((stbi_uc *)src_size_local,(int)local_28,&channels,(int *)&local_68,
                       (int *)((long)&stbi_result + 4),0);
    lVar6 = *in_FS_OFFSET;
    *(undefined8 *)(lVar6 + -0x440) = 0;
    *(undefined8 *)(lVar6 + -0x438) = 0;
    if ((__src == (stbi_uc *)0x0) || (stbi_result._4_4_ == 0)) {
      source_location_00.proc_name = "rf_load_image_from_file_data";
      source_location_00.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location_00.line_in_file = 0x3ca6;
      rf_log_impl(source_location_00,RF_LOG_TYPE_ERROR,
                  "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }"
                  ,7,(ulong)(uint)channels,(ulong)local_68,(ulong)stbi_result._4_4_);
      lVar6 = *in_FS_OFFSET;
      *(char **)(lVar6 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar6 + -0x458) = "rf_load_image_from_file_data";
      *(undefined8 *)(lVar6 + -0x450) = 0x3ca6;
      *(ulong *)(lVar6 + -0x448) = CONCAT44(uStack_14c,7);
    }
    else {
      iVar3 = channels * local_68 * stbi_result._4_4_;
      lVar4 = (long)iVar3;
      uVar5 = 0;
      lVar6 = (ulong)uStack_b4 << 0x20;
      __dest = (void *)(*(code *)allocator_local.user_data)(&src_local,1);
      if (__dest == (void *)0x0) {
        source_location.proc_name = "rf_load_image_from_file_data";
        source_location.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        source_location.line_in_file = 0x3ca1;
        rf_log_impl(source_location,RF_LOG_TYPE_ERROR,"Buffer is not big enough",2,
                    (ulong)(uint)channels,(ulong)local_68,(ulong)stbi_result._4_4_,uVar5,lVar4,lVar6
                   );
        lVar6 = *in_FS_OFFSET;
        *(char **)(lVar6 + -0x460) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(lVar6 + -0x458) = "rf_load_image_from_file_data";
        *(undefined8 *)(lVar6 + -0x450) = 0x3ca1;
        *(ulong *)(lVar6 + -0x448) = CONCAT44(uStack_e4,2);
      }
      else {
        __return_storage_ptr__->data = __dest;
        __return_storage_ptr__->width = channels;
        __return_storage_ptr__->height = local_68;
        __return_storage_ptr__->valid = true;
        switch(stbi_result._4_4_) {
        case 1:
          __return_storage_ptr__->format = RF_UNCOMPRESSED_GRAYSCALE;
          break;
        case 2:
          __return_storage_ptr__->format = RF_UNCOMPRESSED_GRAY_ALPHA;
          break;
        case 3:
          __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8;
          break;
        case 4:
          __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
        }
        memcpy(__dest,__src,(long)iVar3);
      }
      rVar1.proc_name = "rf_load_image_from_file_data";
      rVar1.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar1.line_in_file = 0x3ca4;
      rVar2.size_to_allocate_or_reallocate = 0;
      rVar2.pointer_to_free_or_realloc = __src;
      rVar2._16_8_ = (ulong)uStack_11c << 0x20;
      (*temp_allocator.allocator_proc)(&temp_allocator,rVar1,RF_AM_FREE,rVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_file_data(const void* src, rf_int src_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    // Preconditions
    if (!src || src_size <= 0)
    {
        RF_LOG_ERROR(RF_BAD_ARGUMENT, "Argument `src` was null.");
        return (rf_image) {0};
    }

    // Compute the result
    rf_image result = {0};

    // Use stb image with the `temp_allocator` to decompress the image and get it's data
    int width = 0, height = 0, channels = 0;
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    void* stbi_result = stbi_load_from_memory(src, src_size, &width, &height, &channels, RF_ANY_CHANNELS);
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    if (stbi_result && channels)
    {
        // Allocate a result buffer using the `allocator` and copy the data to it
        int stbi_result_size = width * height * channels;
        void* result_buffer = RF_ALLOC(allocator, stbi_result_size);

        if (result_buffer)
        {
            result.data   = result_buffer;
            result.width  = width;
            result.height = height;
            result.valid  = true;

            // Set the format appropriately depending on the `channels` count
            switch (channels)
            {
                case 1: result.format = RF_UNCOMPRESSED_GRAYSCALE; break;
                case 2: result.format = RF_UNCOMPRESSED_GRAY_ALPHA; break;
                case 3: result.format = RF_UNCOMPRESSED_R8G8B8; break;
                case 4: result.format = RF_UNCOMPRESSED_R8G8B8A8; break;
                default: break;
            }

            memcpy(result_buffer, stbi_result, stbi_result_size);
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Buffer is not big enough", width, height, channels);

        // Free the temp buffer allocated by stbi
        RF_FREE(temp_allocator, stbi_result);
    }
    else RF_LOG_ERROR(RF_STBI_FAILED, "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }", width, height, channels);

    return result;
}